

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::new_block_index
          (ExplicitProducer *this,size_t numberOfFilledSlotsToExpose)

{
  __pointer_type pBVar1;
  __pointer_type pBVar2;
  undefined1 *puVar3;
  size_t *psVar4;
  long in_RSI;
  __pointer_type pBVar5;
  atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
  *in_RDI;
  BlockIndexHeader *header;
  size_t i;
  size_t j;
  BlockIndexEntry *newBlockIndexEntries;
  char *newRawPtr;
  size_t prevBlockSizeMask;
  memory_order __b;
  uint in_stack_ffffffffffffff88;
  __pointer_type local_60;
  __pointer_type local_58;
  bool local_21;
  
  puVar3 = (undefined1 *)((long)&in_RDI[0xd]._M_b._M_p[-1].prev + 7);
  in_RDI[0xd]._M_b._M_p = (__pointer_type)((long)in_RDI[0xd]._M_b._M_p << 1);
  pBVar1 = (__pointer_type)
           ConcurrentQueueDefaultTraits::malloc((long)in_RDI[0xd]._M_b._M_p * 0x10 + 0x27);
  if (pBVar1 == (__pointer_type)0x0) {
    in_RDI[0xd]._M_b._M_p = (__pointer_type)((ulong)in_RDI[0xd]._M_b._M_p >> 1);
    local_21 = false;
  }
  else {
    pBVar2 = (__pointer_type)
             details::
             align_for<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ExplicitProducer::BlockIndexEntry>
                       ((char *)(pBVar1 + 1));
    local_58 = (__pointer_type)0x0;
    if (in_RDI[0xc]._M_b._M_p != (__pointer_type)0x0) {
      local_60 = (__pointer_type)
                 ((long)in_RDI[0xe]._M_b._M_p - (long)in_RDI[0xc]._M_b._M_p & (ulong)puVar3);
      do {
        psVar4 = &(in_RDI[0xf]._M_b._M_p)->size + (long)local_60 * 2;
        pBVar5 = (__pointer_type)((long)&local_58->size + 1);
        (&pBVar2->size)[(long)local_58 * 2] = *psVar4;
        (((atomic<unsigned_long> *)(&pBVar2->size + (long)local_58 * 2 + 1))->
        super___atomic_base<unsigned_long>)._M_i =
             (((atomic<unsigned_long> *)(psVar4 + 1))->super___atomic_base<unsigned_long>)._M_i;
        local_60 = (__pointer_type)((ulong)((long)&local_60->size + 1U) & (ulong)puVar3);
        local_58 = pBVar5;
      } while (local_60 != in_RDI[0xe]._M_b._M_p);
    }
    pBVar1->size = (size_t)in_RDI[0xd]._M_b._M_p;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (pBVar1->front).super___atomic_base<unsigned_long>._M_i = in_RSI - 1;
    pBVar1->entries = (BlockIndexEntry *)pBVar2;
    pBVar1->prev = in_RDI[0x10]._M_b._M_p;
    in_RDI[0xe]._M_b._M_p = local_58;
    in_RDI[0xf]._M_b._M_p = pBVar2;
    in_RDI[0x10]._M_b._M_p = pBVar1;
    std::
    atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
    ::store(in_RDI,(__pointer_type)(ulong)in_stack_ffffffffffffff88,
            (memory_order)((ulong)&pBVar1->front >> 0x20));
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool new_block_index(size_t numberOfFilledSlotsToExpose)
		{
			auto prevBlockSizeMask = pr_blockIndexSize - 1;
			
			// Create the new block
			pr_blockIndexSize <<= 1;
			auto newRawPtr = static_cast<char*>((Traits::malloc)(sizeof(BlockIndexHeader) + std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * pr_blockIndexSize));
			if (newRawPtr == nullptr) {
				pr_blockIndexSize >>= 1;		// Reset to allow graceful retry
				return false;
			}
			
			auto newBlockIndexEntries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(newRawPtr + sizeof(BlockIndexHeader)));
			
			// Copy in all the old indices, if any
			size_t j = 0;
			if (pr_blockIndexSlotsUsed != 0) {
				auto i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & prevBlockSizeMask;
				do {
					newBlockIndexEntries[j++] = pr_blockIndexEntries[i];
					i = (i + 1) & prevBlockSizeMask;
				} while (i != pr_blockIndexFront);
			}
			
			// Update everything
			auto header = new (newRawPtr) BlockIndexHeader;
			header->size = pr_blockIndexSize;
			header->front.store(numberOfFilledSlotsToExpose - 1, std::memory_order_relaxed);
			header->entries = newBlockIndexEntries;
			header->prev = pr_blockIndexRaw;		// we link the new block to the old one so we can free it later
			
			pr_blockIndexFront = j;
			pr_blockIndexEntries = newBlockIndexEntries;
			pr_blockIndexRaw = newRawPtr;
			blockIndex.store(header, std::memory_order_release);
			
			return true;
		}